

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_starts_with(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                     lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_set *plVar1;
  char *__s;
  int iVar2;
  int iVar3;
  size_t __n;
  lys_node *plVar4;
  char *pcVar5;
  long lVar6;
  uint32_t uVar7;
  uint uVar8;
  ly_ctx *plVar9;
  lyd_node *plVar10;
  
  plVar1 = *args;
  if ((options & 0x1cU) == 0) {
    iVar2 = lyxp_set_cast(plVar1,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    pcVar5 = ((*args)->val).str;
    __s = (args[1]->val).str;
    __n = strlen(__s);
    iVar2 = strncmp(pcVar5,__s,__n);
    set_free_content(set);
    set->type = LYXP_SET_BOOLEAN;
    *(uint *)&set->val = (uint)(iVar2 == 0);
    return 0;
  }
  iVar2 = 0;
  if (plVar1->type == LYXP_SET_SNODE_SET) {
    uVar7 = plVar1->used;
    plVar10 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((plVar1->val).nodes[uVar7].pos == 1) {
        plVar10 = (plVar1->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    iVar2 = 0;
    if (plVar10 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar10->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar9 = param_4->ctx;
        pcVar5 = strnodetype(*(LYS_NODE *)&plVar10->ht);
        ly_log(plVar9,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_starts_with",pcVar5,plVar10->schema);
        iVar2 = 1;
      }
      else {
        iVar3 = warn_is_string_type((lys_type *)&plVar10[1].ht);
        if (iVar3 == 0) {
          iVar2 = 1;
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_starts_with",
                 plVar10->schema);
        }
      }
    }
  }
  plVar1 = args[1];
  if (plVar1->type == LYXP_SET_SNODE_SET) {
    uVar8 = plVar1->used;
    plVar10 = (lyd_node *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if ((plVar1->val).nodes[uVar8].pos == 1) {
        plVar10 = (plVar1->val).nodes[uVar8].node;
        break;
      }
    } while (uVar8 != 0);
    if (plVar10 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar10->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar9 = param_4->ctx;
        plVar4 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar10->ht);
        pcVar5 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        iVar3 = warn_is_string_type((lys_type *)&plVar10[1].ht);
        if (iVar3 != 0) goto LAB_00182f33;
        plVar9 = param_4->ctx;
        plVar4 = plVar10->schema;
        pcVar5 = "Argument #2 of %s is node \"%s\", not of string-type.";
      }
      iVar2 = 1;
      ly_log(plVar9,LY_LLWRN,LY_SUCCESS,pcVar5,"xpath_starts_with",plVar4);
    }
  }
LAB_00182f33:
  uVar8 = set->used;
  if ((ulong)uVar8 != 0) {
    lVar6 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar6) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar6);
  }
  return iVar2;
}

Assistant:

static int
xpath_starts_with(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                  struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (strncmp(args[0]->val.str, args[1]->val.str, strlen(args[1]->val.str))) {
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return EXIT_SUCCESS;
}